

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode do_init_writer_stack(Curl_easy *data)

{
  Curl_cwriter *pCVar1;
  CURLcode CVar2;
  Curl_cwriter *writer;
  Curl_cwriter *local_20;
  
  CVar2 = Curl_cwriter_create(&(data->req).writer_stack,data,&Curl_cwt_out,CURL_CW_CLIENT);
  if ((CVar2 == CURLE_OK) &&
     (CVar2 = Curl_cwriter_create(&local_20,data,&cw_download,CURL_CW_PROTOCOL), pCVar1 = local_20,
     CVar2 == CURLE_OK)) {
    CVar2 = Curl_cwriter_add(data,local_20);
    if ((pCVar1 != (Curl_cwriter *)0x0) && (CVar2 != CURLE_OK)) {
      (*pCVar1->cwt->do_close)(data,pCVar1);
      (*Curl_cfree)(pCVar1);
    }
    CVar2 = Curl_cwriter_create(&local_20,data,&cw_raw,CURL_CW_RAW);
    if ((CVar2 == CURLE_OK) &&
       (CVar2 = Curl_cwriter_add(data,local_20),
       local_20 != (Curl_cwriter *)0x0 && CVar2 != CURLE_OK)) {
      (*local_20->cwt->do_close)(data,local_20);
      (*Curl_cfree)(local_20);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode do_init_writer_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &Curl_cwt_out, CURL_CW_CLIENT);
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }
  return result;
}